

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O1

void mserialize::
     StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::serialize<binlog::detail::RecoverableVectorOutputStream>
               (ClockSync *t,RecoverableVectorOutputStream *ostream)

{
  size_t in_RCX;
  uint64_t local_20;
  
  local_20 = t->clockValue;
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x8,in_RCX);
  local_20 = t->clockFrequency;
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x8,in_RCX);
  local_20 = t->nsSinceEpoch;
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x8,in_RCX);
  local_20 = CONCAT44(local_20._4_4_,t->tzOffset);
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x4,in_RCX);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->tzName,ostream);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }